

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O1

void __thiscall Fl_File_Chooser::preview(Fl_File_Chooser *this,int e)

{
  Fl_Group *this_00;
  Fl_File_Browser *pFVar1;
  Fl_Box *pFVar2;
  uint uVar3;
  
  Fl_Button::value((Fl_Button *)this->previewButton,e);
  Fl_Preferences::set(prefs_,"preview",e);
  Fl_Preferences::flush(prefs_);
  this_00 = (this->previewBox->super_Fl_Widget).parent_;
  if (e == 0) {
    pFVar1 = this->fileList;
    (*(pFVar1->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[4]
    )(pFVar1,(ulong)(uint)(pFVar1->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.
                          super_Fl_Widget.x_,
      (ulong)(uint)(pFVar1->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget.y_,
      (ulong)(uint)(this_00->super_Fl_Widget).w_,
      (ulong)(uint)(pFVar1->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget.h_);
    pFVar2 = this->previewBox;
    (*(pFVar2->super_Fl_Widget)._vptr_Fl_Widget[4])
              (pFVar2,(ulong)(uint)((this_00->super_Fl_Widget).w_ + (this_00->super_Fl_Widget).x_),
               (ulong)(uint)(pFVar2->super_Fl_Widget).y_,0,(ulong)(uint)(pFVar2->super_Fl_Widget).h_
              );
    (*(this->previewBox->super_Fl_Widget)._vptr_Fl_Widget[6])();
  }
  else {
    uVar3 = ((this_00->super_Fl_Widget).w_ * 2) / 3;
    pFVar1 = this->fileList;
    (*(pFVar1->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[4]
    )(pFVar1,(ulong)(uint)(pFVar1->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.
                          super_Fl_Widget.x_,
      (ulong)(uint)(pFVar1->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget.y_,
      (ulong)uVar3,
      (ulong)(uint)(pFVar1->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.super_Fl_Widget.h_);
    pFVar2 = this->previewBox;
    (*(pFVar2->super_Fl_Widget)._vptr_Fl_Widget[4])
              (pFVar2,(ulong)((this->fileList->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.
                              super_Fl_Widget.x_ + uVar3),(ulong)(uint)(pFVar2->super_Fl_Widget).y_,
               (ulong)((this_00->super_Fl_Widget).w_ - uVar3),
               (ulong)(uint)(pFVar2->super_Fl_Widget).h_);
    (*(this->previewBox->super_Fl_Widget)._vptr_Fl_Widget[5])();
    update_preview(this);
  }
  Fl_Group::init_sizes(this_00);
  Fl_Widget::redraw(&((this->fileList->super_Fl_Browser).super_Fl_Browser_.super_Fl_Group.
                      super_Fl_Widget.parent_)->super_Fl_Widget);
  return;
}

Assistant:

void Fl_File_Chooser::preview(int e)
{
  previewButton->value(e);
  prefs_->set("preview", e);
  prefs_->flush();

  Fl_Group *p = previewBox->parent();
  if (e) {
    int w = p->w() * 2 / 3;
    fileList->resize(fileList->x(), fileList->y(),
                     w, fileList->h());
    previewBox->resize(fileList->x()+w, previewBox->y(),
                       p->w()-w, previewBox->h());
    previewBox->show();
    update_preview();
  } else {
    fileList->resize(fileList->x(), fileList->y(),
                     p->w(), fileList->h());
    previewBox->resize(p->x()+p->w(), previewBox->y(),
                       0, previewBox->h());
    previewBox->hide();
  }
  p->init_sizes();

  fileList->parent()->redraw();
}